

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixNormalsStep.cpp
# Opt level: O0

bool __thiscall
Assimp::FixInfacingNormalsProcess::ProcessMesh
          (FixInfacingNormalsProcess *this,aiMesh *pcMesh,uint index)

{
  float fVar1;
  bool bVar2;
  float *pfVar3;
  Logger *this_00;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar4;
  basic_formatter *this_01;
  aiFace *paVar5;
  float fVar6;
  double dVar7;
  double dVar8;
  uint local_254;
  uint b;
  aiFace *face;
  uint local_240;
  uint i_2;
  uint i_1;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  string local_b8;
  float local_94;
  float local_90;
  float fDelta1_yz;
  float fDelta1_z;
  float fDelta1_y;
  float fDelta1_x;
  float fDelta0_z;
  float fDelta0_y;
  float fDelta0_x;
  float local_70;
  undefined8 local_64;
  aiVector3D vWithNormal;
  uint i;
  aiVector3D vMax1;
  aiVector3D vMax0;
  aiVector3D vMin1;
  aiVector3D vMin0;
  uint index_local;
  aiMesh *pcMesh_local;
  FixInfacingNormalsProcess *this_local;
  
  vMin0.y = (float)index;
  unique0x10000640 = pcMesh;
  if (pcMesh != (aiMesh *)0x0) {
    bVar2 = aiMesh::HasNormals(pcMesh);
    if (bVar2) {
      aiVector3t<float>::aiVector3t((aiVector3t<float> *)&vMin1.y,1e+10,1e+10,1e+10);
      aiVector3t<float>::aiVector3t((aiVector3t<float> *)&vMax0.y,1e+10,1e+10,1e+10);
      aiVector3t<float>::aiVector3t((aiVector3t<float> *)&vMax1.y,-1e+10,-1e+10,-1e+10);
      aiVector3t<float>::aiVector3t((aiVector3t<float> *)&vWithNormal.z,-1e+10,-1e+10,-1e+10);
      for (vWithNormal.y = 0.0; (uint)vWithNormal.y < stack0xffffffffffffffe0->mNumVertices;
          vWithNormal.y = (float)((int)vWithNormal.y + 1)) {
        pfVar3 = std::min<float>(&vMax0.y,&stack0xffffffffffffffe0->mVertices[(uint)vWithNormal.y].x
                                );
        vMax0.y = *pfVar3;
        pfVar3 = std::min<float>(&vMax0.z,&stack0xffffffffffffffe0->mVertices[(uint)vWithNormal.y].y
                                );
        vMax0.z = *pfVar3;
        pfVar3 = std::min<float>(&vMin1.x,&stack0xffffffffffffffe0->mVertices[(uint)vWithNormal.y].z
                                );
        vMin1.x = *pfVar3;
        pfVar3 = std::max<float>(&vWithNormal.z,
                                 &stack0xffffffffffffffe0->mVertices[(uint)vWithNormal.y].x);
        vWithNormal.z = *pfVar3;
        pfVar3 = std::max<float>((float *)&i,
                                 &stack0xffffffffffffffe0->mVertices[(uint)vWithNormal.y].y);
        i = (uint)*pfVar3;
        pfVar3 = std::max<float>(&vMax1.x,&stack0xffffffffffffffe0->mVertices[(uint)vWithNormal.y].z
                                );
        vMax1.x = *pfVar3;
        _fDelta0_y = ::operator+(stack0xffffffffffffffe0->mVertices + (uint)vWithNormal.y,
                                 stack0xffffffffffffffe0->mNormals + (uint)vWithNormal.y);
        local_64 = _fDelta0_y;
        vWithNormal.x = local_70;
        pfVar3 = std::min<float>(&vMin1.y,(float *)&local_64);
        vMin1.y = *pfVar3;
        pfVar3 = std::min<float>(&vMin1.z,(float *)((long)&local_64 + 4));
        vMin1.z = *pfVar3;
        pfVar3 = std::min<float>(&vMin0.x,&vWithNormal.x);
        vMin0.x = *pfVar3;
        pfVar3 = std::max<float>(&vMax1.y,(float *)&local_64);
        vMax1.y = *pfVar3;
        pfVar3 = std::max<float>(&vMax1.z,(float *)((long)&local_64 + 4));
        vMax1.z = *pfVar3;
        pfVar3 = std::max<float>(&vMax0.x,&vWithNormal.x);
        vMax0.x = *pfVar3;
      }
      fDelta0_z = vMax1.y - vMin1.y;
      fDelta1_x = vMax1.z - vMin1.z;
      fDelta1_y = vMax0.x - vMin0.x;
      fVar6 = vWithNormal.z - vMax0.y;
      fDelta1_yz = (float)i - vMax0.z;
      local_90 = vMax1.x - vMin1.x;
      if (0.0 < fDelta0_z == 0.0 < fVar6) {
        if (0.0 < fDelta1_x == 0.0 < fDelta1_yz) {
          if (0.0 < fDelta1_y == 0.0 < local_90) {
            local_94 = fDelta1_yz * local_90;
            fDelta1_z = fVar6;
            dVar7 = std::sqrt((double)(ulong)(uint)local_94);
            fVar1 = fDelta1_yz;
            if (SUB84(dVar7,0) * 0.05 <= fVar6) {
              dVar7 = std::sqrt((double)(ulong)(uint)(local_90 * fDelta1_z));
              fVar6 = local_90;
              if (SUB84(dVar7,0) * 0.05 <= fVar1) {
                dVar7 = std::sqrt((double)(ulong)(uint)(fDelta1_yz * fDelta1_z));
                if (SUB84(dVar7,0) * 0.05 <= fVar6) {
                  dVar7 = std::fabs((double)(ulong)(uint)(fDelta0_z * fDelta1_x * fDelta1_y));
                  dVar8 = std::fabs((double)(ulong)(uint)(fDelta1_z * local_94));
                  if (SUB84(dVar8,0) <= SUB84(dVar7,0)) {
                    this_local._7_1_ = false;
                  }
                  else {
                    bVar2 = DefaultLogger::isNullLogger();
                    if (!bVar2) {
                      this_00 = DefaultLogger::get();
                      Formatter::
                      basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
                      basic_formatter<char[6]>(&local_230,(char (*) [6])0xc75a7b);
                      pbVar4 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                               Formatter::
                               basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                               operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                                          *)&local_230,(uint *)&vMin0.y);
                      pbVar4 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                               Formatter::
                               basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                               operator_(pbVar4,(char (*) [53])
                                                ": Normals are facing inwards (or the mesh is planar)"
                                        );
                      this_01 = (basic_formatter *)
                                Formatter::
                                basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                                operator_(pbVar4,(uint *)&vMin0.y);
                      Formatter::basic_formatter::operator_cast_to_string(&local_b8,this_01);
                      Logger::info(this_00,&local_b8);
                      std::__cxx11::string::~string((string *)&local_b8);
                      Formatter::
                      basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
                      ~basic_formatter(&local_230);
                    }
                    for (local_240 = 0; local_240 < stack0xffffffffffffffe0->mNumVertices;
                        local_240 = local_240 + 1) {
                      aiVector3t<float>::operator*=
                                (stack0xffffffffffffffe0->mNormals + local_240,-1.0);
                    }
                    for (face._4_4_ = 0; face._4_4_ < stack0xffffffffffffffe0->mNumFaces;
                        face._4_4_ = face._4_4_ + 1) {
                      paVar5 = stack0xffffffffffffffe0->mFaces + face._4_4_;
                      for (local_254 = 0; local_254 < paVar5->mNumIndices >> 1;
                          local_254 = local_254 + 1) {
                        std::swap<unsigned_int>
                                  (paVar5->mIndices + local_254,
                                   paVar5->mIndices + ((paVar5->mNumIndices - 1) - local_254));
                      }
                    }
                    this_local._7_1_ = true;
                  }
                }
                else {
                  this_local._7_1_ = false;
                }
              }
              else {
                this_local._7_1_ = false;
              }
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
    return this_local._7_1_;
  }
  __assert_fail("nullptr != pcMesh",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/PostProcessing/FixNormalsStep.cpp"
                ,0x69,"bool Assimp::FixInfacingNormalsProcess::ProcessMesh(aiMesh *, unsigned int)")
  ;
}

Assistant:

bool FixInfacingNormalsProcess::ProcessMesh( aiMesh* pcMesh, unsigned int index)
{
    ai_assert(nullptr != pcMesh);

    // Nothing to do if there are no model normals
    if (!pcMesh->HasNormals()) {
        return false;
    }

    // Compute the bounding box of both the model vertices + normals and
    // the unmodified model vertices. Then check whether the first BB
    // is smaller than the second. In this case we can assume that the
    // normals need to be flipped, although there are a few special cases ..
    // convex, concave, planar models ...

    aiVector3D vMin0 (1e10f,1e10f,1e10f);
    aiVector3D vMin1 (1e10f,1e10f,1e10f);
    aiVector3D vMax0 (-1e10f,-1e10f,-1e10f);
    aiVector3D vMax1 (-1e10f,-1e10f,-1e10f);

    for (unsigned int i = 0; i < pcMesh->mNumVertices;++i)
    {
        vMin1.x = std::min(vMin1.x,pcMesh->mVertices[i].x);
        vMin1.y = std::min(vMin1.y,pcMesh->mVertices[i].y);
        vMin1.z = std::min(vMin1.z,pcMesh->mVertices[i].z);

        vMax1.x = std::max(vMax1.x,pcMesh->mVertices[i].x);
        vMax1.y = std::max(vMax1.y,pcMesh->mVertices[i].y);
        vMax1.z = std::max(vMax1.z,pcMesh->mVertices[i].z);

        const aiVector3D vWithNormal = pcMesh->mVertices[i] + pcMesh->mNormals[i];

        vMin0.x = std::min(vMin0.x,vWithNormal.x);
        vMin0.y = std::min(vMin0.y,vWithNormal.y);
        vMin0.z = std::min(vMin0.z,vWithNormal.z);

        vMax0.x = std::max(vMax0.x,vWithNormal.x);
        vMax0.y = std::max(vMax0.y,vWithNormal.y);
        vMax0.z = std::max(vMax0.z,vWithNormal.z);
    }

    const float fDelta0_x = (vMax0.x - vMin0.x);
    const float fDelta0_y = (vMax0.y - vMin0.y);
    const float fDelta0_z = (vMax0.z - vMin0.z);

    const float fDelta1_x = (vMax1.x - vMin1.x);
    const float fDelta1_y = (vMax1.y - vMin1.y);
    const float fDelta1_z = (vMax1.z - vMin1.z);

    // Check whether the boxes are overlapping
    if ((fDelta0_x > 0.0f) != (fDelta1_x > 0.0f))return false;
    if ((fDelta0_y > 0.0f) != (fDelta1_y > 0.0f))return false;
    if ((fDelta0_z > 0.0f) != (fDelta1_z > 0.0f))return false;

    // Check whether this is a planar surface
    const float fDelta1_yz = fDelta1_y * fDelta1_z;

    if (fDelta1_x < 0.05f * std::sqrt( fDelta1_yz ))return false;
    if (fDelta1_y < 0.05f * std::sqrt( fDelta1_z * fDelta1_x ))return false;
    if (fDelta1_z < 0.05f * std::sqrt( fDelta1_y * fDelta1_x ))return false;

    // now compare the volumes of the bounding boxes
    if (std::fabs(fDelta0_x * fDelta0_y * fDelta0_z) < std::fabs(fDelta1_x * fDelta1_yz)) {
        if (!DefaultLogger::isNullLogger()) {
            ASSIMP_LOG_INFO_F("Mesh ", index, ": Normals are facing inwards (or the mesh is planar)", index);
        }

        // Invert normals
        for (unsigned int i = 0; i < pcMesh->mNumVertices;++i)
            pcMesh->mNormals[i] *= -1.0f;

        // ... and flip faces
        for (unsigned int i = 0; i < pcMesh->mNumFaces;++i)
        {
            aiFace& face = pcMesh->mFaces[i];
            for( unsigned int b = 0; b < face.mNumIndices / 2; b++)
                std::swap( face.mIndices[b], face.mIndices[ face.mNumIndices - 1 - b]);
        }
        return true;
    }
    return false;
}